

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O1

QNetworkInterface __thiscall
QNativeSocketEnginePrivate::nativeMulticastInterface(QNativeSocketEnginePrivate *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_RSI;
  undefined1 *puVar4;
  QNetworkInterface *this_00;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  socklen_t sizeofv_1;
  uint v_1;
  QHostAddress ipv4;
  socklen_t sizeofv;
  in_addr v;
  QNetworkAddressEntry local_90;
  QArrayDataPointer<QNetworkAddressEntry> local_88;
  QArrayDataPointer<QNetworkInterface> local_68;
  QHostAddress local_48;
  socklen_t local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0xa0) - 1U < 2) {
    local_68.d = (Data *)CONCAT44(local_68.d._4_4_,0xaaaaaaaa);
    local_88.d = (Data *)CONCAT44(local_88.d._4_4_,4);
    iVar3 = getsockopt(*(int *)(in_RSI + 0xd8),0x29,0x11,&local_68,(socklen_t *)&local_88);
    if (iVar3 != -1) {
      QNetworkInterface::interfaceFromIndex((int)this);
      goto LAB_002336a9;
    }
  }
  else {
    local_3c = 0;
    local_40 = 4;
    iVar3 = getsockopt(*(int *)(in_RSI + 0xd8),0,0x20,&local_3c,&local_40);
    if (((iVar3 != -1) && (local_3c != 0)) && (3 < local_40)) {
      local_48.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress::QHostAddress
                (&local_48,
                 local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                 local_3c << 0x18);
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (QNetworkInterface *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkInterface::allInterfaces();
      if ((undefined1 *)local_68.size == (undefined1 *)0x0) {
        QArrayDataPointer<QNetworkInterface>::~QArrayDataPointer(&local_68);
        QHostAddress::~QHostAddress(&local_48);
      }
      else {
        puVar5 = (undefined1 *)0x0;
        do {
          this_00 = (QNetworkInterface *)(local_68.ptr + (long)puVar5);
          local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_88.ptr = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
          QNetworkInterface::addressEntries((QList<QNetworkAddressEntry> *)&local_88,this_00);
          bVar1 = (undefined1 *)local_88.size != (undefined1 *)0x0;
          if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
            bVar2 = false;
          }
          else {
            QNetworkAddressEntry::ip(&local_90);
            bVar2 = QHostAddress::operator==((QHostAddress *)&local_90,&local_48);
            QHostAddress::~QHostAddress((QHostAddress *)&local_90);
            if (!bVar2) {
              puVar4 = (undefined1 *)0x0;
              do {
                puVar4 = puVar4 + 1;
                bVar1 = puVar4 < (ulong)local_88.size;
                if ((ulong)local_88.size <= puVar4) {
                  bVar2 = false;
                  goto LAB_0023364d;
                }
                QNetworkAddressEntry::ip(&local_90);
                bVar2 = QHostAddress::operator==((QHostAddress *)&local_90,&local_48);
                QHostAddress::~QHostAddress((QHostAddress *)&local_90);
              } while (!bVar2);
            }
            QNetworkInterface::QNetworkInterface
                      ((QNetworkInterface *)this,(QNetworkInterface *)this_00);
            bVar2 = true;
          }
LAB_0023364d:
          QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_88);
          if (bVar1) goto LAB_0023366c;
          puVar5 = puVar5 + 1;
        } while (puVar5 < (ulong)local_68.size);
        bVar2 = false;
LAB_0023366c:
        QArrayDataPointer<QNetworkInterface>::~QArrayDataPointer(&local_68);
        QHostAddress::~QHostAddress(&local_48);
        if (bVar2) goto LAB_002336a9;
      }
    }
  }
  QNetworkInterface::QNetworkInterface((QNetworkInterface *)this);
LAB_002336a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QNetworkInterfacePrivate>)
         (QSharedDataPointer<QNetworkInterfacePrivate>)this;
}

Assistant:

QNetworkInterface QNativeSocketEnginePrivate::nativeMulticastInterface() const
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v;
        QT_SOCKOPTLEN_T sizeofv = sizeof(v);
        if (::getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, &sizeofv) == -1)
            return QNetworkInterface();
        return QNetworkInterface::interfaceFromIndex(v);
    }

#if defined(Q_OS_SOLARIS)
    struct in_addr v = { 0, 0, 0, 0};
#else
    struct in_addr v = { 0 };
#endif
    QT_SOCKOPTLEN_T sizeofv = sizeof(v);
    if (::getsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, &sizeofv) == -1)
        return QNetworkInterface();
    if (v.s_addr != 0 && sizeofv >= QT_SOCKOPTLEN_T(sizeof(v))) {
        QHostAddress ipv4(ntohl(v.s_addr));
        QList<QNetworkInterface> ifaces = QNetworkInterface::allInterfaces();
        for (int i = 0; i < ifaces.size(); ++i) {
            const QNetworkInterface &iface = ifaces.at(i);
            QList<QNetworkAddressEntry> entries = iface.addressEntries();
            for (int j = 0; j < entries.size(); ++j) {
                const QNetworkAddressEntry &entry = entries.at(j);
                if (entry.ip() == ipv4)
                    return iface;
            }
        }
    }
    return QNetworkInterface();
}